

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

group * clipp::operator_(group *a,parameter *b)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  __type _Var4;
  ulong uVar5;
  group *pgVar6;
  token<clipp::parameter> *in_RDX;
  parameter *in_RSI;
  group *in_RDI;
  parameter *in_stack_fffffffffffffdf8;
  parameter *ppVar7;
  parameter *in_stack_fffffffffffffe00;
  group *in_stack_fffffffffffffe10;
  group *this;
  parameter local_1b0;
  byte local_a9;
  undefined1 local_a8 [168];
  
  this = in_RDI;
  bVar3 = group::scoped((group *)in_RSI);
  local_a9 = 0;
  bVar2 = false;
  bVar1 = false;
  if ((((bVar3) || (bVar3 = group::blocking(in_stack_fffffffffffffe10), bVar3)) ||
      (bVar3 = group::exclusive((group *)in_RSI), bVar3)) ||
     ((bVar3 = detail::token<clipp::group>::repeatable((token<clipp::group> *)in_RSI), bVar3 ||
      (bVar3 = group::joinable((group *)in_RSI), bVar3)))) {
LAB_0017faa1:
    ppVar7 = (parameter *)local_a8;
    group::group((group *)in_stack_fffffffffffffe00,(group *)ppVar7);
    local_a9 = 1;
    in_stack_fffffffffffffe00 = &local_1b0;
    parameter::parameter(in_stack_fffffffffffffe00,ppVar7);
    bVar2 = true;
    group::group<clipp::parameter>(this,in_RDI,in_RSI);
    bVar1 = true;
    pgVar6 = group::scoped((group *)(local_a8 + 0x48),false);
  }
  else {
    detail::token<clipp::group>::doc_abi_cxx11_((token<clipp::group> *)in_RSI);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      in_stack_fffffffffffffe10 =
           (group *)detail::token<clipp::group>::doc_abi_cxx11_((token<clipp::group> *)in_RSI);
      detail::token<clipp::parameter>::doc_abi_cxx11_(in_RDX);
      _Var4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_RSI,&in_RDX->doc_);
      if (!_Var4) goto LAB_0017faa1;
    }
    pgVar6 = group::push_back((group *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  }
  group::group(in_stack_fffffffffffffe10,pgVar6);
  if (bVar1) {
    group::~group((group *)in_stack_fffffffffffffe00);
  }
  if (bVar2) {
    parameter::~parameter(in_stack_fffffffffffffe00);
  }
  if ((local_a9 & 1) != 0) {
    group::~group((group *)in_stack_fffffffffffffe00);
  }
  return this;
}

Assistant:

inline group
operator , (group a, parameter b)
{
    return !a.scoped() && !a.blocking() && !a.exclusive() && !a.repeatable()
        && !a.joinable() && (a.doc().empty() || a.doc() == b.doc())
       ? a.push_back(std::move(b))
       : group{std::move(a), std::move(b)}.scoped(false);
}